

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O1

int32_t __thiscall icu_63::CollationRootElements::findP(CollationRootElements *this,uint32_t p)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  long lVar9;
  uint32_t *puVar10;
  bool bVar11;
  
  puVar1 = this->elements;
  uVar2 = puVar1[2];
  uVar3 = this->length - 1;
  do {
    if ((int)uVar3 <= (int)(uVar2 + 1)) {
      return uVar2;
    }
    uVar4 = (int)(uVar3 + uVar2) / 2;
    uVar6 = puVar1[(int)uVar4];
    if ((char)uVar6 < '\0') {
      if (uVar4 + 1 != uVar3) {
        lVar9 = (long)(int)(uVar4 + 1);
        do {
          uVar6 = puVar1[lVar9];
          if (-1 < (char)uVar6) {
            uVar4 = (uint32_t)lVar9;
            break;
          }
          lVar9 = lVar9 + 1;
        } while (uVar3 != (uint32_t)lVar9);
      }
      if ((char)uVar6 < '\0') {
        uVar7 = uVar4 - 1;
        uVar5 = uVar4;
        if (uVar7 != uVar2) {
          puVar10 = puVar1 + (long)(int)uVar4 + -1;
          do {
            uVar6 = *puVar10;
            uVar5 = uVar7;
            if (-1 < (char)uVar6) break;
            uVar7 = uVar7 - 1;
            puVar10 = puVar10 + -1;
            uVar5 = uVar4;
          } while (uVar2 != uVar7);
        }
        bVar11 = -1 < (char)uVar6;
        uVar8 = (uint)(int)(char)uVar6 >> 7 & 3;
        uVar4 = uVar5;
      }
      else {
        uVar8 = 0;
        bVar11 = true;
      }
      if (bVar11) goto LAB_0022bf3f;
    }
    else {
LAB_0022bf3f:
      if (p < (uVar6 & 0xffffff00)) {
        uVar3 = uVar4;
        uVar4 = uVar2;
      }
      uVar2 = uVar4;
      uVar8 = 0;
    }
    if (uVar8 != 0) {
      return uVar2;
    }
  } while( true );
}

Assistant:

int32_t
CollationRootElements::findP(uint32_t p) const {
    // p need not occur as a root primary.
    // For example, it might be a reordering group boundary.
    U_ASSERT((p >> 24) != Collation::UNASSIGNED_IMPLICIT_BYTE);
    // modified binary search
    int32_t start = (int32_t)elements[IX_FIRST_PRIMARY_INDEX];
    U_ASSERT(p >= elements[start]);
    int32_t limit = length - 1;
    U_ASSERT(elements[limit] >= PRIMARY_SENTINEL);
    U_ASSERT(p < elements[limit]);
    while((start + 1) < limit) {
        // Invariant: elements[start] and elements[limit] are primaries,
        // and elements[start]<=p<=elements[limit].
        int32_t i = (start + limit) / 2;
        uint32_t q = elements[i];
        if((q & SEC_TER_DELTA_FLAG) != 0) {
            // Find the next primary.
            int32_t j = i + 1;
            for(;;) {
                if(j == limit) { break; }
                q = elements[j];
                if((q & SEC_TER_DELTA_FLAG) == 0) {
                    i = j;
                    break;
                }
                ++j;
            }
            if((q & SEC_TER_DELTA_FLAG) != 0) {
                // Find the preceding primary.
                j = i - 1;
                for(;;) {
                    if(j == start) { break; }
                    q = elements[j];
                    if((q & SEC_TER_DELTA_FLAG) == 0) {
                        i = j;
                        break;
                    }
                    --j;
                }
                if((q & SEC_TER_DELTA_FLAG) != 0) {
                    // No primary between start and limit.
                    break;
                }
            }
        }
        if(p < (q & 0xffffff00)) {  // Reset the "step" bits of a range end primary.
            limit = i;
        } else {
            start = i;
        }
    }
    return start;
}